

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Float_(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
         *this)

{
  Position *this_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  pbVar4 = (byte *)(this->m_position).m_pos;
  pbVar5 = (byte *)(this->m_position).m_end;
  if ((pbVar4 != pbVar5) && (m_alphabet._M_elems[3]._M_elems[*pbVar4] == true)) {
    this_00 = &this->m_position;
    while (pbVar4 != pbVar5) {
      bVar1 = *pbVar4;
      if (m_alphabet._M_elems[2]._M_elems[bVar1] != true) {
        iVar3 = tolower((int)(char)bVar1);
        if (iVar3 != 0x65) {
          if (bVar1 != 0x2e) {
            return false;
          }
          Position::operator++(this_00);
          pbVar4 = (byte *)(this->m_position).m_pos;
          pbVar5 = (byte *)(this->m_position).m_end;
          if ((pbVar4 == pbVar5) || (m_alphabet._M_elems[2]._M_elems[*pbVar4] != true)) {
            Position::operator--(this_00);
            return false;
          }
          while ((pbVar4 != pbVar5 && (m_alphabet._M_elems[2]._M_elems[*pbVar4] == true))) {
            Position::operator++(this_00);
            pbVar4 = (byte *)(this->m_position).m_pos;
            pbVar5 = (byte *)(this->m_position).m_end;
          }
        }
        bVar2 = read_exponent_and_suffix(this);
        return bVar2;
      }
      Position::operator++(this_00);
      pbVar5 = (byte *)(this->m_position).m_end;
      pbVar4 = (byte *)(this->m_position).m_pos;
    }
  }
  return false;
}

Assistant:

constexpr bool has_more() const noexcept { return m_pos != m_end; }